

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_deleglise_rivat_parallel1.cpp
# Opt level: O3

int256_t * __thiscall
primesum::pi_deleglise_rivat_parallel1
          (int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined4 uVar7;
  primesum *ppVar8;
  int64_t c;
  runtime_error *this_00;
  undefined4 in_ECX;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_register_00000014;
  string *psVar11;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int threads_00;
  char *pcVar19;
  string *expr;
  ulong uVar20;
  ulong uVar21;
  int128_t *piVar22;
  char *pcVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string limit;
  int256_t s1;
  int256_t p2;
  int256_t s2_hard;
  int256_t s2_easy;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c [12];
  string local_158;
  primesum *local_130;
  double local_128;
  string *local_120;
  long local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  long local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  ulong local_e8;
  int256_t *local_e0;
  string local_d8;
  int256_t local_b8;
  char *local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  int256_t local_78;
  int256_t local_58;
  
  psVar11 = (string *)CONCAT44(in_register_00000014,threads);
  local_118 = CONCAT44(local_118._4_4_,in_ECX);
  if (-(long)psVar11 < (long)(ulong)((primesum *)0x1 < this)) {
    auVar32._4_12_ = in_stack_fffffffffffffe9c;
    auVar32._0_4_ = in_stack_fffffffffffffe98;
    expr = psVar11;
    local_128 = get_alpha_deleglise_rivat(this,(int128_t)auVar32);
    get_max_x_abi_cxx11_(&local_d8,(primesum *)expr,local_128);
    ppVar8 = (primesum *)to_int128((int128_t *)&local_d8,expr);
    if ((SBORROW8(extraout_RDX,(long)psVar11) !=
        SBORROW8(extraout_RDX - (long)psVar11,(ulong)(ppVar8 < this))) !=
        (long)((extraout_RDX - (long)psVar11) - (ulong)(ppVar8 < this)) < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_158,"pi(x): x must be <= ",&local_d8);
      std::runtime_error::runtime_error(this_00,(string *)&local_158);
      *(undefined ***)this_00 = &PTR__runtime_error_0013f910;
      __cxa_throw(this_00,&primesum_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_130 = this;
    local_e0 = __return_storage_ptr__;
    dVar30 = (double)__floattidf(this,psVar11);
    pow(dVar30,0.3333333333333333);
    auVar31 = __fixdfti();
    local_120 = psVar11;
    if ((long)(ulong)(auVar31._0_8_ == 0) <= auVar31._8_8_) {
      do {
        lVar18 = auVar31._8_8_;
        uVar20 = auVar31._0_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar20;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar20;
        lVar26 = SUB168(auVar3 * auVar5,8) + uVar20 * lVar18 * 2;
        auVar32 = __divti3(local_130,psVar11,uVar20,lVar18);
        uVar21 = (ulong)(auVar32._0_8_ < SUB168(auVar3 * auVar5,0));
        lVar24 = auVar32._8_8_ - lVar26;
        if ((SBORROW8(auVar32._8_8_,lVar26) != SBORROW8(lVar24,uVar21)) ==
            (long)(lVar24 - uVar21) < 0) goto LAB_0011e9e7;
        auVar31._8_8_ = lVar18 + -1 + (ulong)(uVar20 != 0);
        auVar31._0_8_ = uVar20 - 1;
      } while (-lVar18 < (long)(ulong)(1 < uVar20));
      auVar31 = ZEXT816(0);
    }
LAB_0011e9e7:
    do {
      lVar18 = auVar31._8_8_;
      uVar20 = auVar31._0_8_;
      uVar21 = uVar20 + 1;
      lVar24 = lVar18 + (ulong)(0xfffffffffffffffe < uVar20);
      auVar31._8_8_ = lVar24;
      auVar31._0_8_ = uVar21;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar21;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar21;
      lVar26 = SUB168(auVar4 * auVar6,8) + uVar21 * lVar24 * 2;
      auVar32 = __divti3(local_130,local_120,uVar21,lVar24);
      uVar21 = (ulong)(auVar32._0_8_ < SUB168(auVar4 * auVar6,0));
      lVar24 = auVar32._8_8_ - lVar26;
    } while ((SBORROW8(auVar32._8_8_,lVar26) != SBORROW8(lVar24,uVar21)) ==
             (long)(lVar24 - uVar21) < 0);
    dVar30 = (double)__floattidf(uVar20,lVar18);
    psVar11 = local_120;
    ppVar8 = local_130;
    piVar22 = (int128_t *)(long)(local_128 * dVar30);
    c = __divti3(local_130,local_120,piVar22,(long)piVar22 >> 0x3f);
    threads_00 = 6;
    if ((long)piVar22 < 0xd) {
      threads_00 = (&PhiTiny::pi)[(long)piVar22];
    }
    paVar1 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"=== pi_deleglise_rivat_parallel1(x) ===","");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar7 = (undefined4)local_118;
    x_00._4_12_ = in_stack_fffffffffffffe9c;
    x_00._0_4_ = in_stack_fffffffffffffe98;
    print(ppVar8,(int128_t)x_00,(int64_t)psVar11,(int64_t)piVar22,c,local_128,threads_00);
    x_01._4_12_ = in_stack_fffffffffffffe9c;
    x_01._0_4_ = in_stack_fffffffffffffe98;
    P2((int256_t *)&local_98,ppVar8,(int128_t)x_01,(int64_t)psVar11,(int)piVar22);
    x_02._4_12_ = in_stack_fffffffffffffe9c;
    x_02._0_4_ = in_stack_fffffffffffffe98;
    S1(&local_b8,ppVar8,(int128_t)x_02,(int64_t)psVar11,(int64_t)piVar22,threads_00);
    x_03._4_12_ = in_stack_fffffffffffffe9c;
    x_03._0_4_ = uVar7;
    S2_trivial((int256_t *)&local_158,ppVar8,(int128_t)x_03,(int64_t)psVar11,(int64_t)piVar22,c,
               threads_00);
    x_04._4_12_ = in_stack_fffffffffffffe9c;
    x_04._0_4_ = uVar7;
    S2_easy(&local_58,ppVar8,(int128_t)x_04,(int64_t)psVar11,(int64_t)piVar22,c,threads_00);
    x_05._4_12_ = in_stack_fffffffffffffe9c;
    x_05._0_4_ = uVar7;
    S2_hard(&local_78,ppVar8,(int128_t)x_05,(int64_t)psVar11,(int64_t)piVar22,c,threads_00);
    local_f8 = local_158.field_2._8_8_;
    local_100 = local_158.field_2._M_allocated_capacity;
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_158._M_dataplus._M_p;
    local_e8 = local_158._M_string_length;
    local_108 = local_78.high._8_8_;
    local_110 = (ulong)local_78.high;
    local_120 = (string *)local_78.low._8_8_;
    local_118 = local_b8.high._8_8_;
    local_128 = (double)(ulong)local_b8.high;
    local_130 = (primesum *)(ulong)local_b8.low;
    piVar22 = prime_sum_tiny(piVar22,(int64_t)ppVar8);
    __return_storage_ptr__ = local_e0;
    uVar12 = (ulong)local_58.high + local_100 + local_110;
    pcVar19 = local_f0->_M_local_buf + (ulong)local_58.low;
    uVar25 = local_58.low._8_8_ + local_e8 + (ulong)CARRY8((ulong)local_58.low,(ulong)local_f0);
    uVar21 = (ulong)(CARRY8(local_58.low._8_8_,local_e8) ||
                    CARRY8(local_58.low._8_8_ + local_e8,
                           (ulong)CARRY8((ulong)local_58.low,(ulong)local_f0)));
    uVar13 = uVar12 + uVar21;
    pcVar23 = pcVar19 + (ulong)local_78.low;
    uVar20 = (long)local_120 + uVar25;
    uVar9 = uVar20 + CARRY8((ulong)local_78.low,(ulong)pcVar19);
    uVar20 = (ulong)(CARRY8((ulong)local_120,uVar25) ||
                    CARRY8(uVar20,(ulong)CARRY8((ulong)local_78.low,(ulong)pcVar19)));
    uVar14 = uVar13 + uVar20;
    uVar15 = uVar14 + (long)local_128;
    uVar25 = local_b8.low._8_8_ + uVar9;
    uVar27 = uVar25 + CARRY8((ulong)local_130,(ulong)pcVar23);
    uVar25 = (ulong)(CARRY8(local_b8.low._8_8_,uVar9) ||
                    CARRY8(uVar25,(ulong)CARRY8((ulong)local_130,(ulong)pcVar23)));
    uVar16 = uVar15 + uVar25;
    uVar10 = (long)extraout_RDX_00 >> 0x3f;
    uVar17 = uVar16 + uVar10;
    pcVar19 = (char *)((long)piVar22 + (long)(pcVar23 + (long)local_130));
    uVar9 = (ulong)CARRY8((ulong)piVar22,(ulong)(pcVar23 + (long)local_130));
    uVar2 = uVar27 + extraout_RDX_00;
    uVar28 = uVar2 + uVar9;
    uVar9 = (ulong)(CARRY8(uVar27,extraout_RDX_00) || CARRY8(uVar2,uVar9));
    uVar27 = uVar17 + uVar9;
    pcVar23 = pcVar19 + -1;
    uVar2 = (ulong)(pcVar19 == (char *)0x0);
    uVar29 = uVar28 - uVar2;
    uVar2 = (ulong)(uVar28 < uVar2);
    uVar28 = uVar27 - uVar2;
    lVar18 = uVar28 - local_88;
    lVar24 = (((uVar10 + local_58.high._8_8_ + local_f8 +
                         (ulong)CARRY8((ulong)local_58.high,local_100) + local_108 +
                         (ulong)CARRY8((ulong)local_58.high + local_100,local_110) +
                         (ulong)CARRY8(uVar12,uVar21) + (ulong)CARRY8(uVar13,uVar20) + local_118 +
                         (ulong)CARRY8(uVar14,(ulong)local_128) + (ulong)CARRY8(uVar15,uVar25) +
                (ulong)CARRY8(uVar16,uVar10) + (ulong)CARRY8(uVar17,uVar9)) -
              (ulong)(uVar27 < uVar2)) - local_80) - (ulong)(uVar28 < local_88);
    *(long *)&local_e0->high = lVar18;
    *(long *)((long)&local_e0->high + 8) = lVar24;
    *(long *)&local_e0->low = (long)pcVar23 - (long)local_98;
    uVar21 = (ulong)(pcVar23 < local_98);
    uVar20 = uVar29 - local_90;
    *(ulong *)((long)&local_e0->low + 8) = uVar20 - uVar21;
    if (uVar29 < local_90 || uVar20 < uVar21) {
      *(long *)&local_e0->high = lVar18 + -1;
      *(ulong *)((long)&local_e0->high + 8) = lVar24 + -1 + (ulong)(lVar18 != 0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_deleglise_rivat_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  string limit = get_max_x(alpha);

  if (x > to_int128(limit))
    throw primesum_error("pi(x): x must be <= " + limit);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t z = (int64_t) (x / y);
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_deleglise_rivat_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, z, c, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}